

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

shared_ptr<kratos::PortBundleRef> __thiscall
kratos::Generator::add_bundle_port_def
          (Generator *this,string *port_name,PortBundleDefinition *def,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *debug_info)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
  *pmVar2;
  element_type *this_00;
  Port *pPVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_R8;
  shared_ptr<kratos::PortBundleRef> sVar5;
  Port *port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> base_name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>
  *iter;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
  *__range1;
  undefined1 local_68 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
  definition;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *debug_info_local;
  PortBundleDefinition *def_local;
  string *port_name_local;
  Generator *this_local;
  shared_ptr<kratos::PortBundleRef> *ref;
  
  definition._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  add_bundle_port_def(this,port_name,def);
  pmVar2 = PortBundleDefinition::definition_abi_cxx11_((PortBundleDefinition *)debug_info);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
         *)local_68,pmVar2);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
                    *)local_68);
  iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
                   *)local_68);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&iter);
    if (!bVar1) break;
    base_name.field_2._8_8_ =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string((string *)&port,(string *)base_name.field_2._8_8_);
    this_00 = std::
              __shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    pPVar3 = PortBundleRef::get_port(this_00,(string *)&port);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>const&>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(pPVar3->super_Var).super_IRNode.fn_name_ln,in_R8);
    std::__cxx11::string::~string((string *)&port);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>
    ::operator++(&__end1);
  }
  definition._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
          *)local_68);
  _Var4._M_pi = extraout_RDX;
  if ((definition._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    std::shared_ptr<kratos::PortBundleRef>::~shared_ptr((shared_ptr<kratos::PortBundleRef> *)this);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::PortBundleRef>)
         sVar5.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PortBundleRef> Generator::add_bundle_port_def(
    const std::string &port_name, const PortBundleDefinition &def,
    const std::pair<std::string, uint32_t> &debug_info) {
    auto ref = add_bundle_port_def(port_name, def);
    auto definition = def.definition();
    for (auto const &iter : definition) {
        auto base_name = iter.first;
        auto &port = ref->get_port(base_name);
        port.fn_name_ln.emplace_back(debug_info);
    }
    return ref;
}